

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

sexp_conflict
sexp_set_signal_action_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg2,sexp_conflict arg3)

{
  int iVar1;
  sexp psVar2;
  sexp_conflict psVar3;
  sigaction *__act;
  long lVar4;
  
  if ((((ulong)arg2 & 1) == 0) || (lVar4 = (long)arg2 >> 1, 0x1e < lVar4 - 1U)) {
    psVar3 = (sexp_conflict)sexp_xtype_exception(ctx,self,"not a valid signal number",arg2);
    return psVar3;
  }
  if (((((ulong)arg3 & 3) != 0) || ((arg3->tag != 0x14 && (arg3->tag != 0x1b)))) &&
     (((ulong)arg3 | 0x100) != 0x13e)) {
    psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,0x14,arg3);
    return psVar3;
  }
  psVar2 = (((ctx->value).type.setters)->value).context.result;
  if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 10)) {
    psVar2 = (sexp)sexp_make_vector_op(ctx,0,2,0x41,0x3e);
    (((ctx->value).type.setters)->value).context.result = psVar2;
    psVar2 = (((ctx->value).type.setters)->value).context.result;
  }
  if (((ulong)arg3 | 0x100) == 0x13e) {
    __act = &call_sigdefault;
    if (arg3 == (sexp_conflict)0x3e) {
      __act = &call_sigignore;
    }
  }
  else {
    __act = &call_sigaction;
  }
  psVar3 = *(sexp_conflict *)((long)&psVar2->value + lVar4 * 8 + 8);
  iVar1 = sigaction((int)lVar4,(sigaction *)__act,(sigaction *)0x0);
  if (iVar1 == 0) {
    *(sexp_conflict *)
     ((long)&((((ctx->value).type.setters)->value).context.result)->value + lVar4 * 8 + 8) = arg3;
    sexp_signal_contexts[lVar4] = ctx;
    return psVar3;
  }
  psVar3 = (sexp_conflict)sexp_user_exception(ctx,self,"couldn\'t set signal",arg2);
  return psVar3;
}

Assistant:

sexp sexp_set_signal_action_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg2, sexp arg3) {
  sexp res;
  res = sexp_set_signal_action(ctx, self, arg2, arg3);
  return res;
}